

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O3

void __thiscall
mocker::nasm::Section::
emplaceLine<mocker::nasm::CJump,mocker::nasm::CJump::OpType,std::shared_ptr<mocker::nasm::Label>>
          (Section *this,string *label,OpType *args,shared_ptr<mocker::nasm::Label> *args_1)

{
  size_t *psVar1;
  OpType OVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Node *p_Var5;
  shared_ptr<mocker::nasm::CJump> local_38;
  
  local_38.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_38.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_38.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_38.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e95d8;
  local_38.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_38.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  OVar2 = *args;
  peVar3 = (args_1->super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (args_1->super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  (args_1->super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (args_1->super___shared_ptr<mocker::nasm::Label,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__CJump_001e9628;
  local_38.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = OVar2;
  local_38.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)peVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_38.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [2]._M_use_count = p_Var4;
  p_Var5 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
           _M_create_node<std::__cxx11::string,std::shared_ptr<mocker::nasm::CJump>>
                     ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&this->lines,
                      label,&local_38);
  std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
  psVar1 = &(this->lines).super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_38.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void emplaceLine(std::string label, Args &&... args) {
    lines.emplace_back(std::move(label),
                       std::make_shared<Type>(std::forward<Args>(args)...));
  }